

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameplayDisplayer.cpp
# Opt level: O0

GameplayDisplayer * GameplayDisplayer::getInstance(void)

{
  GameplayDisplayer *this;
  
  if (gameplayDisplayer == (GameplayDisplayer *)0x0) {
    this = (GameplayDisplayer *)operator_new(0x18);
    GameplayDisplayer(this);
    gameplayDisplayer = this;
  }
  return gameplayDisplayer;
}

Assistant:

GameplayDisplayer* GameplayDisplayer::getInstance() {
    if (gameplayDisplayer == nullptr) {
        gameplayDisplayer = new GameplayDisplayer();
    }
    return gameplayDisplayer;
}